

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O0

bool __thiscall
vk::MemoryRequirement::matchesHeap(MemoryRequirement *this,VkMemoryPropertyFlags heapFlags)

{
  VkMemoryPropertyFlags heapFlags_local;
  MemoryRequirement *this_local;
  
  if (((this->m_flags & 1) == 0) || ((heapFlags & 2) != 0)) {
    if (((this->m_flags & 2) == 0) || ((heapFlags & 4) != 0)) {
      if (((this->m_flags & 4) == 0) || ((heapFlags & 0x10) != 0)) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MemoryRequirement::matchesHeap (VkMemoryPropertyFlags heapFlags) const
{
	// sanity check
	if ((m_flags & FLAG_COHERENT) && !(m_flags & FLAG_HOST_VISIBLE))
		DE_FATAL("Coherent memory must be host-visible");
	if ((m_flags & FLAG_HOST_VISIBLE) && (m_flags & FLAG_LAZY_ALLOCATION))
		DE_FATAL("Lazily allocated memory cannot be mappable");

	// host-visible
	if ((m_flags & FLAG_HOST_VISIBLE) && !(heapFlags & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT))
		return false;

	// coherent
	if ((m_flags & FLAG_COHERENT) && !(heapFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT))
		return false;

	// lazy
	if ((m_flags & FLAG_LAZY_ALLOCATION) && !(heapFlags & VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT))
		return false;

	return true;
}